

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool anon_unknown.dwarf_1f0a16::ParseKeyPath
               (vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *split,
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *out,bool *apostrophe,string *error,bool allow_multipath)

{
  string_view separators;
  Span<const_char> elem_00;
  Span<const_char> elem_01;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  reference pSVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  reference pvVar7;
  byte in_R8B;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar8;
  size_t i_1;
  optional<unsigned_int> *op_num_1;
  type_conflict *inserted;
  type *_;
  optional<unsigned_int> *op_num;
  Span<const_char> *num;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *__range3;
  Span<const_char> *elem;
  size_t i;
  KeyPath branch_path;
  iterator __end3;
  iterator __begin3;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> nums;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_multipath;
  vector<unsigned_int,_std::allocator<unsigned_int>_> multipath_values;
  KeyPath path;
  optional<unsigned_long> multipath_segment_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  value_type in_stack_fffffffffffffd54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  allocator<char> *in_stack_fffffffffffffd60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__args;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  _Node_iterator_base<unsigned_int,_false> in_stack_fffffffffffffd78;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffd80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_248;
  string *in_stack_fffffffffffffdc8;
  type *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdf8;
  ulong local_1f8;
  byte local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  size_t sStack_1a0;
  long local_190;
  _Node_iterator_base<unsigned_int,_false> local_188;
  undefined1 local_180;
  char *local_178;
  size_t sStack_170;
  Span<const_char> *local_160;
  Span<const_char> *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_111 [3];
  _Optional_payload_base<unsigned_int> local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  _Node_iterator_base<unsigned_int,_false> local_90;
  undefined1 local_88;
  _Optional_payload_base<unsigned_int> local_80;
  undefined8 local_78;
  undefined8 local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd48);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)in_stack_fffffffffffffd48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd48);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)in_stack_fffffffffffffd48);
  local_1f8 = 1;
  do {
    sVar2 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::size
                      ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                       in_stack_fffffffffffffd48);
    if (sVar2 <= local_1f8) {
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<unsigned_long> *)in_stack_fffffffffffffd48);
      if (bVar1) {
        local_248 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        while (__args = local_248,
              pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_fffffffffffffd48), __args < pvVar6) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffffd58,
                              CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
          in_stack_fffffffffffffd54 = *pvVar7;
          std::optional<unsigned_long>::operator*
                    ((optional<unsigned_long> *)in_stack_fffffffffffffd48);
          in_stack_fffffffffffffd58 = &local_1c0;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffffd58,
                              CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
          *pvVar7 = in_stack_fffffffffffffd54;
          std::
          vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)in_stack_fffffffffffffd68,__args);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffd58);
          local_248 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      ((long)&(local_248->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + 1);
        }
      }
      else {
        std::
        vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
        ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)in_stack_fffffffffffffd68,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd60)
        ;
      }
      local_1c1 = 1;
LAB_0020bbfc:
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)in_stack_fffffffffffffd48);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd58);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd58);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return (bool)(local_1c1 & 1);
    }
    pvVar3 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                       ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                        in_stack_fffffffffffffd58,
                        CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    bVar1 = Span<const_char>::empty((Span<const_char> *)in_stack_fffffffffffffd48);
    if (((bVar1) ||
        (pcVar4 = Span<const_char>::front((Span<const_char> *)in_stack_fffffffffffffd48),
        *pcVar4 != '<')) ||
       (pcVar4 = Span<const_char>::back((Span<const_char> *)in_stack_fffffffffffffd48),
       *pcVar4 != '>')) {
      local_1c0.field_2._8_8_ = pvVar3->m_data;
      sStack_1a0 = pvVar3->m_size;
      elem_01.m_size = (size_t)pvVar3;
      elem_01.m_data = in_stack_fffffffffffffdf8;
      in_stack_fffffffffffffd68 =
           (_Optional_payload_base<unsigned_int>)
           ParseKeyPathNum(elem_01,(bool *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_a8 = in_stack_fffffffffffffd68;
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<unsigned_int> *)in_stack_fffffffffffffd48);
      if (!bVar1) {
        local_1c1 = 0;
        goto LAB_0020bbfc;
      }
      std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffffd48);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd68,
                 (uint *)in_stack_fffffffffffffd60);
    }
    else {
      if ((in_R8B & 1) == 0) {
        Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffd48);
        __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffd48);
        this = local_111;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd78._M_cur,
                   (char *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                   (char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        tinyformat::format<std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffd78._M_cur,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (this,__str);
        std::__cxx11::string::~string(in_stack_fffffffffffffd48);
        std::__cxx11::string::~string(in_stack_fffffffffffffd48);
        std::allocator<char>::~allocator((allocator<char> *)local_111);
        local_1c1 = 0;
        goto LAB_0020bbfc;
      }
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<unsigned_long> *)in_stack_fffffffffffffd48);
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffd58,
                   (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        local_1c1 = 0;
        goto LAB_0020bbfc;
      }
      Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffd48);
      Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffd48);
      Span<const_char>::Span<const_char,_0>
                ((Span<const_char> *)in_stack_fffffffffffffd58,
                 (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (char *)in_stack_fffffffffffffd48);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd68,
                 (char *)in_stack_fffffffffffffd60);
      separators._M_str = (char *)in_stack_fffffffffffffda8;
      separators._M_len = (size_t)in_stack_fffffffffffffda0;
      util::Split<Span<char_const>>((Span<const_char> *)in_stack_fffffffffffffd80,separators);
      sVar2 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::size
                        ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                         in_stack_fffffffffffffd48);
      if (sVar2 < 2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffd58,
                   (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        local_1c1 = 0;
        bVar1 = true;
      }
      else {
        local_158 = (Span<const_char> *)
                    std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::begin
                              ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        local_160 = (Span<const_char> *)
                    std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::end
                              ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        while (bVar1 = __gnu_cxx::
                       operator==<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                                 ((__normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                                   *)in_stack_fffffffffffffd58,
                                  (__normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          pSVar5 = __gnu_cxx::
                   __normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                   ::operator*((__normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                                *)in_stack_fffffffffffffd48);
          local_178 = pSVar5->m_data;
          sStack_170 = pSVar5->m_size;
          elem_00.m_size = (size_t)pvVar3;
          elem_00.m_data = in_stack_fffffffffffffdf8;
          in_stack_fffffffffffffd80 =
               (_Optional_payload_base<unsigned_int>)
               ParseKeyPathNum(elem_00,(bool *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          local_80 = in_stack_fffffffffffffd80;
          bVar1 = std::optional::operator_cast_to_bool
                            ((optional<unsigned_int> *)in_stack_fffffffffffffd48);
          if (!bVar1) {
            local_1c1 = 0;
            bVar1 = true;
            goto LAB_0020b9fc;
          }
          std::optional<unsigned_int>::operator*
                    ((optional<unsigned_int> *)in_stack_fffffffffffffd48);
          pVar8 = std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)in_stack_fffffffffffffd58,
                           (value_type *)
                           CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
          in_stack_fffffffffffffd78._M_cur =
               (__node_type *)pVar8.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
          in_stack_fffffffffffffd77 = pVar8.second;
          local_188._M_cur = in_stack_fffffffffffffd78._M_cur;
          local_180 = in_stack_fffffffffffffd77;
          local_90._M_cur = in_stack_fffffffffffffd78._M_cur;
          local_88 = in_stack_fffffffffffffd77;
          in_stack_fffffffffffffdd0 =
               std::get<0ul,std::__detail::_Node_iterator<unsigned_int,true,false>,bool>
                         ((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                          in_stack_fffffffffffffd48);
          in_stack_fffffffffffffdc8 =
               (string *)
               std::get<1ul,std::__detail::_Node_iterator<unsigned_int,true,false>,bool>
                         ((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                          in_stack_fffffffffffffd48);
          if (((ulong)(in_stack_fffffffffffffdc8->_M_dataplus)._M_p & 1) == 0) {
            std::optional<unsigned_int>::operator*
                      ((optional<unsigned_int> *)in_stack_fffffffffffffd48);
            tinyformat::format<unsigned_int>
                      ((char *)in_stack_fffffffffffffd78._M_cur,
                       (uint *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
            std::__cxx11::string::~string(in_stack_fffffffffffffd48);
            local_1c1 = 0;
            bVar1 = true;
            goto LAB_0020b9fc;
          }
          std::optional<unsigned_int>::operator*
                    ((optional<unsigned_int> *)in_stack_fffffffffffffd48);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffd68,(uint *)in_stack_fffffffffffffd60);
          __gnu_cxx::
          __normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
          ::operator++((__normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                        *)in_stack_fffffffffffffd48);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd58)
        ;
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_fffffffffffffd48);
        local_190 = sVar2 - 1;
        std::optional<unsigned_long>::optional<unsigned_long,_true>
                  ((optional<unsigned_long> *)in_stack_fffffffffffffd58,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        local_78 = local_a0;
        local_70 = local_98;
        bVar1 = false;
      }
LAB_0020b9fc:
      std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::~vector
                ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                 in_stack_fffffffffffffd58);
      if (bVar1) goto LAB_0020bbfc;
    }
    local_1f8 = local_1f8 + 1;
  } while( true );
}

Assistant:

[[nodiscard]] bool ParseKeyPath(const std::vector<Span<const char>>& split, std::vector<KeyPath>& out, bool& apostrophe, std::string& error, bool allow_multipath)
{
    KeyPath path;
    std::optional<size_t> multipath_segment_index;
    std::vector<uint32_t> multipath_values;
    std::unordered_set<uint32_t> seen_multipath;

    for (size_t i = 1; i < split.size(); ++i) {
        const Span<const char>& elem = split[i];

        // Check if element contain multipath specifier
        if (!elem.empty() && elem.front() == '<' && elem.back() == '>') {
            if (!allow_multipath) {
                error = strprintf("Key path value '%s' specifies multipath in a section where multipath is not allowed", std::string(elem.begin(), elem.end()));
                return false;
            }
            if (multipath_segment_index) {
                error = "Multiple multipath key path specifiers found";
                return false;
            }

            // Parse each possible value
            std::vector<Span<const char>> nums = Split(Span(elem.begin()+1, elem.end()-1), ";");
            if (nums.size() < 2) {
                error = "Multipath key path specifiers must have at least two items";
                return false;
            }

            for (const auto& num : nums) {
                const auto& op_num = ParseKeyPathNum(num, apostrophe, error);
                if (!op_num) return false;
                auto [_, inserted] = seen_multipath.insert(*op_num);
                if (!inserted) {
                    error = strprintf("Duplicated key path value %u in multipath specifier", *op_num);
                    return false;
                }
                multipath_values.emplace_back(*op_num);
            }

            path.emplace_back(); // Placeholder for multipath segment
            multipath_segment_index = path.size()-1;
        } else {
            const auto& op_num = ParseKeyPathNum(elem, apostrophe, error);
            if (!op_num) return false;
            path.emplace_back(*op_num);
        }
    }

    if (!multipath_segment_index) {
        out.emplace_back(std::move(path));
    } else {
        // Replace the multipath placeholder with each value while generating paths
        for (size_t i = 0; i < multipath_values.size(); i++) {
            KeyPath branch_path = path;
            branch_path[*multipath_segment_index] = multipath_values[i];
            out.emplace_back(std::move(branch_path));
        }
    }
    return true;
}